

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void apply_to_each(dill_stream c,void *insns,virtual_mach_info vmi,apply_func func)

{
  basic_block_conflict pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (vmi->bbcount != 0) {
    uVar3 = 0;
    do {
      pbVar1 = vmi->bblist;
      uVar2 = pbVar1[uVar3].start;
      if (uVar2 <= (ulong)pbVar1[uVar3].end) {
        do {
          (*func)(c,pbVar1 + uVar3,(virtual_insn *)insns,(int)uVar2);
          uVar2 = uVar2 + 1;
        } while (uVar2 <= (ulong)pbVar1[uVar3].end);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(long)vmi->bbcount);
  }
  return;
}

Assistant:

static void
apply_to_each(dill_stream c,
              void* insns,
              virtual_mach_info vmi,
              apply_func func)
{
    size_t i, j = 0;

    for (i = 0; i < vmi->bbcount; i++) {
        basic_block bb = &vmi->bblist[i];
        for (j = (size_t)bb->start; j <= (size_t)bb->end; j++) {
            (func)(c, bb, insns, (int)j);
        }
    }
}